

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O2

int s3gau_write_full(char *fn,vector_t ****out,uint32 n_mgau,uint32 n_feat,uint32 n_density,
                    uint32 *veclen)

{
  int32 iVar1;
  uint uVar2;
  FILE *fp;
  ulong uVar3;
  int iVar4;
  uint32 chksum;
  uint32 n_feat_local;
  uint32 n_density_local;
  uint32 n_mgau_local;
  uint32 ignore;
  
  chksum = 0;
  ignore = 0;
  n_feat_local = n_feat;
  n_density_local = n_density;
  n_mgau_local = n_mgau;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  fp = s3open(fn,"wb",(uint32 *)0x0);
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fwrite(&n_mgau_local,4,1,fp,0,&chksum);
    if (((iVar1 == 1) && (iVar1 = bio_fwrite(&n_feat_local,4,1,fp,0,&chksum), iVar1 == 1)) &&
       (iVar1 = bio_fwrite(&n_density_local,4,1,fp,0,&chksum), iVar1 == 1)) {
      iVar4 = 0;
      uVar2 = bio_fwrite(veclen,4,n_feat_local,fp,0,&chksum);
      if (uVar2 == n_feat_local) {
        for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
          iVar4 = iVar4 + veclen[uVar3] * veclen[uVar3];
        }
        iVar4 = bio_fwrite_1d(****out,4,iVar4 * n_mgau_local * n_density_local,fp,&chksum);
        if ((-1 < iVar4) && (iVar1 = bio_fwrite(&chksum,4,1,fp,0,&ignore), iVar1 == 1)) {
          s3close(fp);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                  ,0xf9,"Wrote %s [%ux%ux%u array of full matrices]\n",fn,(ulong)n_mgau_local,
                  (ulong)n_feat_local,(ulong)n_density_local);
          return 0;
        }
      }
    }
    s3close(fp);
  }
  return -1;
}

Assistant:

int
s3gau_write_full(const char *fn,
		 const vector_t ****out,
		 uint32 n_mgau,
		 uint32 n_feat,
		 uint32 n_density,
		 const uint32 *veclen)
{
    FILE *fp = NULL;
    uint32 chksum = 0;
    uint32 blk, i, ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", GAU_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite(&n_mgau, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(&n_feat, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(&n_density, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(veclen, sizeof(uint32), n_feat, fp, 0, &chksum) != n_feat) {
	goto error;
    }

    for (blk = 0, i = 0; i < n_feat; i++)
	blk += veclen[i] * veclen[i];

    if (bio_fwrite_1d(out[0][0][0][0], sizeof(float32),
		   n_mgau*n_density*blk, fp, &chksum) < 0) {
	goto error;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	goto error;
    }

    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array of full matrices]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);
    return S3_ERROR;
}